

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                   uint16_t *histogram_symbols,HuffmanTreeCode *huffman_codes)

{
  PixOrCopy *p;
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  VP8LBackwardRefs *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  ushort *in_R8;
  long in_R9;
  int distance;
  int code_2;
  int n_bits;
  int bits;
  int literal_ix;
  int code_1;
  int code;
  int k;
  PixOrCopy *v;
  VP8LRefsCursor c;
  HuffmanTreeCode *codes;
  int histogram_ix;
  int tile_y;
  int tile_x;
  int y;
  int x;
  int tile_mask;
  int histo_xsize;
  int in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  uint uVar4;
  uint32_t in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_74;
  VP8LRefsCursor local_68;
  long local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint32_t local_2c;
  long local_28;
  ushort *local_20;
  VP8LBackwardRefs *local_18;
  uint32_t local_10;
  uint32_t local_c;
  long local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_EDX == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = VP8LSubSampleSize(in_ESI,in_EDX);
  }
  if (local_10 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = -(1 << ((byte)local_10 & 0x1f));
  }
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = (uint)*local_20;
  local_50 = local_28 + (long)(int)(local_44 * 5) * 0x18;
  local_30 = uVar4;
  local_2c = uVar1;
  VP8LRefsCursorInit(&local_68,local_18);
  while (iVar2 = VP8LRefsCursorOk(&local_68), p = local_68.cur_pos, iVar2 != 0) {
    if ((local_3c != (local_34 & local_30)) || (local_40 != (local_38 & local_30))) {
      local_3c = local_34 & local_30;
      local_40 = local_38 & local_30;
      in_stack_ffffffffffffff64 = ((int)local_38 >> ((byte)local_10 & 0x1f)) * local_2c;
      local_44 = (uint)local_20[in_stack_ffffffffffffff64 +
                                ((int)local_34 >> ((byte)local_10 & 0x1f))];
      local_50 = local_28 + (long)(int)(local_44 * 5) * 0x18;
    }
    iVar2 = PixOrCopyIsLiteral(local_68.cur_pos);
    if (iVar2 == 0) {
      iVar2 = PixOrCopyIsCacheIdx(p);
      if (iVar2 == 0) {
        in_stack_ffffffffffffff70 = PixOrCopyDistance(p);
        VP8LPrefixEncode(in_stack_ffffffffffffff74,(int *)CONCAT44(uVar1,uVar4),
                         (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        WriteHuffmanCodeWithExtraBits
                  ((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (HuffmanTreeCode *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffff64,
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        VP8LPrefixEncode(in_stack_ffffffffffffff74,(int *)CONCAT44(uVar1,uVar4),
                         (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffff64);
        VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      }
      else {
        PixOrCopyCacheIdx(p);
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffff64);
      }
    }
    else {
      for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
        PixOrCopyLiteral(p,(uint)"\x01\x02"[local_74]);
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffff64);
      }
    }
    uVar3 = PixOrCopyLength(p);
    for (local_34 = uVar3 + local_34; (int)local_c <= (int)local_34; local_34 = local_34 - local_c)
    {
      local_38 = local_38 + 1;
    }
    VP8LRefsCursorNext((VP8LRefsCursor *)0x1781a6);
  }
  return (uint)(*(int *)(local_8 + 0x28) != 0);
}

Assistant:

static WebPEncodingError StoreImageToBitMask(
    VP8LBitWriter* const bw, int width, int histo_bits,
    const VP8LBackwardRefs* const refs,
    const uint16_t* histogram_symbols,
    const HuffmanTreeCode* const huffman_codes) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = histogram_symbols[0];
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = histogram_symbols[(y >> histo_bits) * histo_xsize +
                                       (x >> histo_bits)];
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  return bw->error_ ? VP8_ENC_ERROR_OUT_OF_MEMORY : VP8_ENC_OK;
}